

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__Name_array
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  uint64 uVar5;
  int iVar6;
  byte *pbVar7;
  xmlChar **ppxVar8;
  bool failed;
  bool local_39;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  pbVar3[0] = 0;
  pbVar3[1] = 0;
  pbVar3[2] = 0;
  pbVar3[3] = 0;
  pbVar3[4] = 0;
  pbVar3[5] = 0;
  pbVar3[6] = 0;
  pbVar3[7] = 0;
  pbVar3[8] = 0;
  pbVar3[9] = 0;
  pbVar3[10] = 0;
  pbVar3[0xb] = 0;
  pbVar3[0xc] = 0;
  pbVar3[0xd] = 0;
  pbVar3[0xe] = 0;
  pbVar3[0xf] = 0;
  pbVar3[0x10] = 0;
  pbVar3[0x11] = 0;
  pbVar3[0x12] = 0;
  pbVar3[0x13] = 0;
  pbVar3[0x14] = 0;
  pbVar3[0x15] = 0;
  pbVar3[0x16] = 0;
  pbVar3[0x17] = 0;
  pbVar3[0x18] = 0;
  pbVar3[0x19] = 0;
  pbVar3[0x1a] = 0;
  pbVar3[0x1b] = 0;
  pbVar3[0x1c] = 0;
  pbVar3[0x1d] = 0;
  pbVar3[0x1e] = 0;
  pbVar3[0x1f] = 0;
  *attributeDataPtr = pbVar3;
  ppxVar8 = attributes->attributes;
  if (ppxVar8 != (xmlChar **)0x0) {
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        iVar6 = 3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        pbVar7 = pbVar3 + 8;
        if (SVar4 == 0x6f4) {
LAB_00721c40:
          *(ParserChar **)pbVar7 = buffer;
        }
        else if (SVar4 == 0x6a6c54) {
          uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,&local_39);
          *(uint64 *)(pbVar3 + 0x18) = uVar5;
          if (local_39 == true) {
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                               0xb5dd0b9,0x6a6c54,buffer);
            if (!bVar1) goto LAB_00721cc1;
            iVar6 = 1;
          }
          else {
LAB_00721cc1:
            iVar6 = 4;
            bVar2 = true;
            if (local_39 == false) {
              *pbVar3 = *pbVar3 | 1;
            }
          }
          if (!bVar2) goto LAB_00721c4c;
        }
        else {
          pbVar7 = pbVar3 + 0x10;
          if (SVar4 == 0x74835) goto LAB_00721c40;
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0xb5dd0b9,
                             text,buffer);
          iVar6 = 1;
          if (bVar2) goto LAB_00721c4c;
        }
        iVar6 = 0;
      }
LAB_00721c4c:
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return false;
    }
  }
  if (((*pbVar3 & 1) == 0) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                         0xb5dd0b9,0x6a6c54,(ParserChar *)0x0), bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__Name_array( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__Name_array( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

Name_array__AttributeData* attributeData = newData<Name_array__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_COUNT:
    {
bool failed;
attributeData->count = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NAME_ARRAY,
        HASH_ATTRIBUTE_COUNT,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NAME_ARRAY, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_NAME_ARRAY, HASH_ATTRIBUTE_COUNT, 0 ) )
        return false;
}


    return true;
}